

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationSpeed::Update
          (ChLinkMotorRotationSpeed *this,double mytime,bool update_assets)

{
  long lVar1;
  ChFrame<double> *Fb;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *pgVar7;
  DstXprType **ppDVar8;
  Index index;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Index size;
  Index size_1;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ChMatrix33<double> Jw2;
  ChMatrix33<double> Jw1;
  ChQuaternion<double> q;
  ChFrame<double> aframe2;
  ChMatrix33<double> mtempQ;
  ChMatrix33<double> abs_plane_rotating;
  ChFrame<double> aframe1;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *local_478;
  ChMatrix33<double> *local_470;
  ulong local_468;
  ChMatrix33<double> local_458;
  DstXprType local_408;
  ChFrame<double> local_3c0;
  ChFrame<double> local_338;
  ChFrame<double> local_2b0;
  ChMatrix33<double> local_228;
  ChQuaternion<double> local_1d8;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double local_198;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_188;
  DstEvaluatorType *local_168;
  ulong local_160;
  ulong uStack_158;
  undefined8 local_150;
  DstEvaluatorType *local_148;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  Fb = (ChFrame<double> *)
       (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.Body1;
  if (Fb == (ChFrame<double> *)0x0) {
    return;
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
      super_ChLink.Body2 == (ChBodyFrame *)0x0) {
    return;
  }
  ChFrame<double>::operator>>
            (&local_b8,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,Fb)
  ;
  ChFrame<double>::operator>>
            (&local_2b0,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  local_140._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.pos.m_data[2] = 0.0;
  local_338._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_338.coord.pos.m_data[0] = 0.0;
  local_338.coord.pos.m_data[1] = 0.0;
  local_338.coord.pos.m_data[2] = 0.0;
  local_338.coord.rot.m_data[0] = 1.0;
  local_338.coord.rot.m_data[1] = 0.0;
  local_338.coord.rot.m_data[2] = 0.0;
  local_338.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_338.Amatrix,(ChQuaternion<double> *)&local_140);
  ChFrame<double>::TransformParentToLocal(&local_2b0,&local_b8,&local_338);
  local_140._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_140.coord.pos.m_data[2] = 0.0;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.rot.m_data[0] = 1.0;
  local_3c0._0_16_ = ZEXT816(0x3ff0000000000000);
  local_3c0._0_32_ = ZEXT1632((undefined1  [16])local_3c0._0_16_);
  local_140.coord.rot.m_data[1] = 0.0;
  local_140.coord.rot.m_data[2] = 0.0;
  local_140.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_140.Amatrix,(ChQuaternion<double> *)&local_3c0);
  if (this->avoid_angle_drift == true) {
    dVar19 = this->aux_dt + *(double *)&(this->super_ChLinkMotorRotation).field_0x278;
  }
  else {
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_338.coord.rot.m_data[1];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_338.coord.rot.m_data[2] * local_338.coord.rot.m_data[2];
    auVar17 = vfmadd231sd_fma(auVar17,auVar22,auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_338.coord.rot.m_data[3];
    auVar17 = vfmadd231sd_fma(auVar17,auVar23,auVar23);
    if (auVar17._0_8_ <= 1e-30) {
      dVar19 = local_338.coord.rot.m_data[3] + local_338.coord.rot.m_data[3];
    }
    else {
      auVar17 = vsqrtsd_avx(auVar17,auVar17);
      dVar19 = atan2(auVar17._0_8_,local_338.coord.rot.m_data[0]);
      dVar19 = ((dVar19 + dVar19) / auVar17._0_8_) * local_338.coord.rot.m_data[3];
    }
  }
  Q_from_AngAxis(&local_1d8,dVar19,(ChVector<double> *)&VECT_Z);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_2b0.coord.rot.m_data[1];
  auVar4._8_8_ = local_1d8.m_data[1];
  auVar4._0_8_ = local_1d8.m_data[0];
  auVar4._16_8_ = local_1d8.m_data[2];
  auVar4._24_8_ = local_1d8.m_data[3];
  auVar21._24_8_ = local_2b0.coord.rot.m_data[3];
  auVar21._16_8_ = local_2b0.coord.rot.m_data[2];
  auVar28._24_8_ = local_1d8.m_data[1];
  auVar28._16_8_ = local_1d8.m_data[1];
  auVar24._0_8_ = -local_2b0.coord.rot.m_data[1];
  auVar24._8_8_ = 0x8000000000000000;
  auVar2 = vpermpd_avx2(auVar4,1);
  auVar26._0_8_ = -local_2b0.coord.rot.m_data[2];
  auVar26._8_8_ = -local_2b0.coord.rot.m_data[3];
  auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(local_1d8.m_data[3],local_1d8.m_data[2])),0x15);
  auVar17 = vunpcklpd_avx(auVar24,auVar20);
  auVar25._16_16_ = auVar24;
  auVar25._0_16_ = auVar26;
  auVar21._0_16_ = auVar17;
  auVar18._0_8_ = auVar2._0_8_ * auVar17._0_8_;
  auVar18._8_8_ = auVar2._8_8_ * auVar17._8_8_;
  auVar18._16_8_ = auVar2._16_8_ * local_2b0.coord.rot.m_data[2];
  auVar18._24_8_ = auVar2._24_8_ * local_2b0.coord.rot.m_data[3];
  auVar2._8_8_ = local_2b0.coord.rot.m_data[0];
  auVar2._0_8_ = local_2b0.coord.rot.m_data[0];
  auVar2._16_8_ = local_2b0.coord.rot.m_data[0];
  auVar2._24_8_ = local_2b0.coord.rot.m_data[0];
  auVar18 = vfmadd231pd_avx512vl(auVar18,auVar4,auVar2);
  auVar27._24_8_ = local_2b0.coord.rot.m_data[3];
  auVar27._16_8_ = local_2b0.coord.rot.m_data[3];
  auVar28._8_8_ = local_1d8.m_data[2];
  auVar28._0_8_ = local_1d8.m_data[2];
  auVar2 = vpermpd_avx2(auVar21,0x66);
  auVar2 = vshufpd_avx(auVar25,auVar2,9);
  auVar27._0_16_ = auVar26;
  auVar4 = vpermpd_avx2(auVar27,0x24);
  auVar17 = vfmadd213pd_fma(auVar28,auVar4,auVar18);
  auVar17 = vfmadd213pd_fma(auVar2,auVar3,ZEXT1632(auVar17));
  local_3c0._0_32_ = ZEXT1632(auVar17);
  ChFrame<double>::SetRot(&local_140,(ChQuaternion<double> *)&local_3c0);
  local_3c0._0_16_ = ZEXT816(0xb03780);
  local_3c0._0_32_ = ZEXT1632((undefined1  [16])local_3c0._0_16_);
  local_3c0.coord.rot.m_data[0] = 1.0;
  local_1d8.m_data[0] = 1.0;
  local_1d8.m_data[1] = 0.0;
  local_1d8.m_data[2] = 0.0;
  local_1d8.m_data[3] = 0.0;
  local_3c0.coord.rot.m_data[1] = 0.0;
  local_3c0.coord.rot.m_data[2] = 0.0;
  local_3c0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)((long)&local_3c0 + 0x40),&local_1d8);
  ChFrame<double>::TransformParentToLocal(&local_140,&local_b8,&local_3c0);
  local_188.m_dst = (DstEvaluatorType *)&local_228;
  local_198 = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  local_1d8.m_data[0] =
       local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_1d8.m_data[1] =
       local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_1d8.m_data[2] =
       local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_1d8.m_data[3] =
       local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dStack_1b8 = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  dStack_1b0 = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  dStack_1a8 = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
  dStack_1a0 = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  local_188.m_functor = (assign_op<double,_double> *)&local_478;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                  super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
                super_ChFrame<double>.Amatrix;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_1d8;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_1d8;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_408;
  local_188.m_src = (SrcEvaluatorType *)&local_458;
  local_188.m_dstExpr = &local_408;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_188);
  local_188.m_functor =
       (assign_op<double,_double> *)
       &(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
          super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
        Amatrix;
  local_188.m_dst = (DstEvaluatorType *)&local_1d8;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_458,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_188);
  auVar6._8_8_ = local_3c0.coord.rot.m_data[2];
  auVar6._0_8_ = local_3c0.coord.rot.m_data[1];
  local_188.m_dstExpr = (DstXprType *)(local_3c0.coord.rot.m_data[3] * 0.5);
  auVar5._8_8_ = 0x3fe0000000000000;
  auVar5._0_8_ = 0x3fe0000000000000;
  auVar17 = vmulpd_avx512vl(auVar6,auVar5);
  local_188.m_dst = (DstEvaluatorType *)(local_3c0.coord.rot.m_data[0] * 0.5);
  local_188.m_src = (SrcEvaluatorType *)-(double)local_188.m_dstExpr;
  local_188.m_functor = auVar17._8_8_;
  local_160 = auVar17._0_8_ ^ 0x8000000000000000;
  uStack_158 = (ulong)local_188.m_functor ^ 0x8000000000000000;
  local_150 = vmovlpd_avx(auVar17);
  local_478 = &local_188;
  local_470 = (ChMatrix33<double> *)&local_408;
  local_168 = local_188.m_dst;
  local_148 = local_188.m_dst;
  ChMatrix33<double>::operator=
            (&local_228,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_478);
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_478 = &local_188;
  local_470 = &local_458;
  ChMatrix33<double>::operator=
            (&local_228,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_478);
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  uVar14 = (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_z +
           (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_y +
           (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_x;
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rx == true) {
    uVar10 = (ulong)(uVar14 & 0xff);
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar10) goto LAB_005b67a2;
    *(double *)
     ((long)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data +
     uVar10 * 8) = local_3c0.coord.rot.m_data[1];
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    uVar9 = local_468;
    pgVar7 = local_478;
    if ((long)local_468 < 0) goto LAB_005b6764;
    uVar12 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar12 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar12)) {
      uVar12 = local_468;
    }
    uVar16 = local_468 - uVar12;
    uVar15 = uVar16 + 7;
    if (-1 < (long)uVar16) {
      uVar15 = uVar16;
    }
    if (uVar12 != 0) {
      memset(local_478,0,uVar12 * 8);
    }
    lVar1 = (uVar15 & 0xfffffffffffffff8) + uVar12;
    if (7 < (long)uVar16) {
      lVar13 = uVar12 + 8;
      if ((long)(uVar12 + 8) < lVar1) {
        lVar13 = lVar1;
      }
      memset(&pgVar7->m_dst + uVar12,0,(~uVar12 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar9) {
      memset(&pgVar7[((long)uVar15 >> 3) * 2].m_dst + uVar12,0,((long)uVar16 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    uVar9 = local_468;
    pgVar7 = local_478;
    if ((long)local_468 < 0) goto LAB_005b6764;
    uVar12 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar12 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar12)) {
      uVar12 = local_468;
    }
    uVar16 = local_468 - uVar12;
    uVar15 = uVar16 + 7;
    if (-1 < (long)uVar16) {
      uVar15 = uVar16;
    }
    if (uVar12 != 0) {
      memset(local_478,0,uVar12 * 8);
    }
    lVar1 = (uVar15 & 0xfffffffffffffff8) + uVar12;
    if (7 < (long)uVar16) {
      lVar13 = uVar12 + 8;
      if ((long)(uVar12 + 8) < lVar1) {
        lVar13 = lVar1;
      }
      memset(&pgVar7->m_dst + uVar12,0,(~uVar12 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar9) {
      memset(&pgVar7[((long)uVar15 >> 3) * 2].m_dst + uVar12,0,((long)uVar16 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b6783;
    uVar9 = 3;
    ppDVar8 = &local_478->m_dstExpr;
    if (((ulong)ppDVar8 & 7) == 0) {
      uVar11 = -((uint)((ulong)ppDVar8 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar11 < 3) {
        uVar9 = (ulong)uVar11;
      }
      if (uVar11 != 0) goto LAB_005b5fc0;
    }
    else {
LAB_005b5fc0:
      uVar12 = 0;
      do {
        ppDVar8[uVar12] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    if (uVar9 < 3) {
      do {
        ppDVar8[uVar9] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b6783;
    uVar10 = 3;
    ppDVar8 = &local_478->m_dstExpr;
    if (((ulong)ppDVar8 & 7) == 0) {
      uVar11 = -((uint)((ulong)ppDVar8 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar11 < 3) {
        uVar10 = (ulong)uVar11;
      }
      if (uVar11 != 0) goto LAB_005b6050;
    }
    else {
LAB_005b6050:
      uVar9 = 0;
      do {
        ppDVar8[uVar9] =
             (DstXprType *)
             local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    if (uVar10 < 3) {
      do {
        ppDVar8[uVar10] =
             (DstXprType *)
             local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    uVar14 = uVar14 + 1;
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_ry == true) {
    uVar10 = (ulong)uVar14;
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar10) goto LAB_005b67a2;
    *(double *)
     ((long)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data +
     uVar10 * 8) = local_3c0.coord.rot.m_data[2];
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    uVar9 = local_468;
    pgVar7 = local_478;
    if ((long)local_468 < 0) goto LAB_005b6764;
    uVar12 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar12 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar12)) {
      uVar12 = local_468;
    }
    uVar16 = local_468 - uVar12;
    uVar15 = uVar16 + 7;
    if (-1 < (long)uVar16) {
      uVar15 = uVar16;
    }
    if (uVar12 != 0) {
      memset(local_478,0,uVar12 * 8);
    }
    lVar1 = (uVar15 & 0xfffffffffffffff8) + uVar12;
    if (7 < (long)uVar16) {
      lVar13 = uVar12 + 8;
      if ((long)(uVar12 + 8) < lVar1) {
        lVar13 = lVar1;
      }
      memset(&pgVar7->m_dst + uVar12,0,(~uVar12 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar9) {
      memset(&pgVar7[((long)uVar15 >> 3) * 2].m_dst + uVar12,0,((long)uVar16 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    uVar9 = local_468;
    pgVar7 = local_478;
    if ((long)local_468 < 0) goto LAB_005b6764;
    uVar12 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar12 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar12)) {
      uVar12 = local_468;
    }
    uVar16 = local_468 - uVar12;
    uVar15 = uVar16 + 7;
    if (-1 < (long)uVar16) {
      uVar15 = uVar16;
    }
    if (uVar12 != 0) {
      memset(local_478,0,uVar12 * 8);
    }
    lVar1 = (uVar15 & 0xfffffffffffffff8) + uVar12;
    if (7 < (long)uVar16) {
      lVar13 = uVar12 + 8;
      if ((long)(uVar12 + 8) < lVar1) {
        lVar13 = lVar1;
      }
      memset(&pgVar7->m_dst + uVar12,0,(~uVar12 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar9) {
      memset(&pgVar7[((long)uVar15 >> 3) * 2].m_dst + uVar12,0,((long)uVar16 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b6783;
    uVar9 = 3;
    ppDVar8 = &local_478->m_dstExpr;
    if (((ulong)ppDVar8 & 7) == 0) {
      uVar11 = -((uint)((ulong)ppDVar8 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar11 < 3) {
        uVar9 = (ulong)uVar11;
      }
      if (uVar11 != 0) goto LAB_005b6317;
    }
    else {
LAB_005b6317:
      uVar12 = 0;
      do {
        ppDVar8[uVar12] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar12 + 3];
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    if (uVar9 < 3) {
      do {
        ppDVar8[uVar9] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar9 + 3];
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar14) goto LAB_005b6742;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b6783;
    uVar10 = 3;
    ppDVar8 = &local_478->m_dstExpr;
    if (((ulong)ppDVar8 & 7) == 0) {
      uVar11 = -((uint)((ulong)ppDVar8 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar11 < 3) {
        uVar10 = (ulong)uVar11;
      }
      if (uVar11 != 0) goto LAB_005b63a7;
    }
    else {
LAB_005b63a7:
      uVar9 = 0;
      do {
        ppDVar8[uVar9] =
             *(DstXprType **)
              ((long)local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array + uVar9 * 8 + 0x18);
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    if (uVar10 < 3) {
      do {
        ppDVar8[uVar10] =
             *(DstXprType **)
              ((long)local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array + uVar10 * 8 + 0x18);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    uVar14 = uVar14 + 1;
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rz != true) {
    return;
  }
  uVar10 = (ulong)uVar14;
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <= (long)uVar10
     ) {
LAB_005b67a2:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                 );
  }
  *(double *)
   ((long)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data +
   uVar10 * 8) = local_3c0.coord.rot.m_data[3];
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar14) goto LAB_005b6742;
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
  uVar9 = local_468;
  pgVar7 = local_478;
  if ((long)local_468 < 0) {
LAB_005b6764:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                 );
  }
  uVar12 = local_468;
  if ((((ulong)local_478 & 7) == 0) &&
     (uVar12 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar12)) {
    uVar12 = local_468;
  }
  uVar16 = local_468 - uVar12;
  uVar15 = uVar16 + 7;
  if (-1 < (long)uVar16) {
    uVar15 = uVar16;
  }
  if (uVar12 != 0) {
    memset(local_478,0,uVar12 * 8);
  }
  lVar1 = (uVar15 & 0xfffffffffffffff8) + uVar12;
  if (7 < (long)uVar16) {
    lVar13 = uVar12 + 8;
    if ((long)(uVar12 + 8) < lVar1) {
      lVar13 = lVar1;
    }
    memset(&pgVar7->m_dst + uVar12,0,(~uVar12 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar1 < (long)uVar9) {
    memset(&pgVar7[((long)uVar15 >> 3) * 2].m_dst + uVar12,0,((long)uVar16 % 8) * 8);
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar14) goto LAB_005b6742;
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
  uVar9 = local_468;
  pgVar7 = local_478;
  if ((long)local_468 < 0) goto LAB_005b6764;
  uVar12 = local_468;
  if ((((ulong)local_478 & 7) == 0) &&
     (uVar12 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar12)) {
    uVar12 = local_468;
  }
  uVar16 = local_468 - uVar12;
  uVar15 = uVar16 + 7;
  if (-1 < (long)uVar16) {
    uVar15 = uVar16;
  }
  if (uVar12 != 0) {
    memset(local_478,0,uVar12 * 8);
  }
  lVar1 = (uVar15 & 0xfffffffffffffff8) + uVar12;
  if (7 < (long)uVar16) {
    lVar13 = uVar12 + 8;
    if ((long)(uVar12 + 8) < lVar1) {
      lVar13 = lVar1;
    }
    memset(&pgVar7->m_dst + uVar12,0,(~uVar12 + lVar13 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar1 < (long)uVar9) {
    memset(&pgVar7[((long)uVar15 >> 3) * 2].m_dst + uVar12,0,((long)uVar16 % 8) * 8);
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar14) goto LAB_005b6742;
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
  if ((long)local_468 < 6) goto LAB_005b6783;
  uVar9 = 3;
  ppDVar8 = &local_478->m_dstExpr;
  if (((ulong)ppDVar8 & 7) == 0) {
    uVar11 = -((uint)((ulong)ppDVar8 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar11 < 3) {
      uVar9 = (ulong)uVar11;
    }
    if (uVar11 != 0) goto LAB_005b666e;
  }
  else {
LAB_005b666e:
    uVar12 = 0;
    do {
      ppDVar8[uVar12] =
           (DstXprType *)
           local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar12 + 6];
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  if (uVar9 < 3) {
    do {
      ppDVar8[uVar9] =
           (DstXprType *)
           local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar9 + 6];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar14) {
LAB_005b6742:
    __assert_fail("(i >= 0) && (i < nconstr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                  ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
  }
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
  if ((long)local_468 < 6) {
LAB_005b6783:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  uVar10 = 3;
  ppDVar8 = &local_478->m_dstExpr;
  if (((ulong)ppDVar8 & 7) == 0) {
    uVar14 = -((uint)((ulong)ppDVar8 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar14 < 3) {
      uVar10 = (ulong)uVar14;
    }
    if (uVar14 == 0) goto LAB_005b6713;
  }
  uVar9 = 0;
  do {
    ppDVar8[uVar9] =
         *(DstXprType **)
          ((long)local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + uVar9 * 8 + 0x30);
    uVar9 = uVar9 + 1;
  } while (uVar10 != uVar9);
LAB_005b6713:
  if (uVar10 < 3) {
    do {
      ppDVar8[uVar10] =
           *(DstXprType **)
            ((long)local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar10 * 8 + 0x30);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
  }
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
        ChFrame<> aframe2 = this->frame2 >> (*this->Body2);

        ChFrame<> aframe12;
        aframe2.TransformParentToLocal(aframe1, aframe12);

        ChFrame<> aframe2rotating;

        double aux_rotation;

        if (this->avoid_angle_drift) {
            aux_rotation = this->aux_dt + this->rot_offset;
        } else {
            // to have it aligned to current rot, to allow C=0.
            aux_rotation = aframe12.GetRot().Q_to_Rotv().z();
        }

        aframe2rotating.SetRot(aframe2.GetRot() * Q_from_AngAxis(aux_rotation, VECT_Z));

        ChFrame<> aframe12rotating;
        aframe2rotating.TransformParentToLocal(aframe1, aframe12rotating);

        ChMatrix33<> abs_plane_rotating = aframe2rotating.GetA();

        ChMatrix33<> Jw1 = abs_plane_rotating.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -abs_plane_rotating.transpose() * Body2->GetA();

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(aframe12rotating.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(1, 1) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(2, 2) = 0.5 * aframe12rotating.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            nc++;
        }
        if (c_y) {
            nc++;
        }
        if (c_z) {
            nc++;
        }
        if (c_rx) {
            C(nc) = aframe12rotating.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = aframe12rotating.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = aframe12rotating.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}